

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::MayEmitIfNonDefaultCheck
          (anon_unknown_0 *this,Printer *p,string_view prefix,FieldDescriptor *field,
          AnyInvocable<void_()> *emit_body,bool with_enclosing_braces_always)

{
  Printer *pPVar1;
  bool bVar2;
  long *plVar3;
  MaybeInitializedPtr MVar4;
  long lVar5;
  long alStack_258 [3];
  undefined1 *puStack_240;
  undefined1 auStack_238 [24];
  Printer *local_220;
  MaybeInitializedPtr local_218;
  _Head_base<0UL,_google::protobuf::FeatureSetDefaults_*,_false> local_210;
  once_flag *local_208;
  long lStack_200;
  MaybeInitializedPtr local_1f8;
  FeatureSetDefaults *local_1f0;
  undefined1 local_1e8 [16];
  ExtensionRange *local_1d8;
  FieldDescriptor *local_1d0;
  undefined1 local_1c8 [24];
  Printer *local_1b0;
  FeatureSet *local_1a8;
  MaybeInitializedPtr local_1a0;
  FeatureSetDefaults *local_198;
  long local_190;
  long lStack_188;
  undefined1 local_180 [24];
  code *local_168;
  byte local_160;
  Descriptor *local_158;
  undefined8 local_150;
  undefined1 local_148 [88];
  char local_f0;
  ExtensionRange *local_e8;
  FieldDescriptor *local_e0;
  ExtensionRange local_d8;
  code *local_b0;
  undefined1 local_a8;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90 [16];
  undefined1 local_80;
  undefined1 local_38;
  
  local_1c8._16_8_ = prefix._M_str;
  local_1a8 = (FeatureSet *)prefix._M_len;
  puStack_240 = (undefined1 *)0xdec52f;
  local_220 = (Printer *)this;
  local_1b0 = p;
  bVar2 = ShouldEmitNonDefaultCheck((FieldDescriptor *)local_1c8._16_8_);
  pPVar1 = local_220;
  if (bVar2) {
    puStack_240 = (undefined1 *)0xdec559;
    local_218.p = &local_208;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"condition","");
    local_1a0.p = &local_190;
    if ((once_flag **)local_218.p == &local_208) {
      lStack_188 = lStack_200;
    }
    else {
      local_1a0.p = local_218.p;
    }
    local_198 = local_210._M_head_impl;
    local_210._M_head_impl = (FeatureSetDefaults *)0x0;
    local_208._0_1_ = 0;
    puStack_240 = (undefined1 *)0xdec644;
    local_218.p = &local_208;
    local_180._0_8_ = operator_new(0x20);
    *(Printer ***)local_180._0_8_ = &local_220;
    (((FieldDescriptor *)local_180._0_8_)->all_names_).payload_ = (char *)&local_1b0;
    ((FieldDescriptor *)local_180._0_8_)->file_ = (FileDescriptor *)(local_1c8 + 0x10);
    *(undefined1 *)&((FieldDescriptor *)local_180._0_8_)->type_once_ = 0;
    local_168 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                ::_M_invoke;
    local_180._8_8_ = 0;
    local_180._16_8_ =
         std::
         _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
         ::_M_manager;
    local_160 = '\x01';
    local_158 = (Descriptor *)local_148;
    local_150 = 0;
    local_148[0] = '\0';
    local_148[0x10] = 0;
    puStack_240 = (undefined1 *)0xdec6d4;
    std::__cxx11::string::_M_replace((ulong)&local_158,0,(char *)0x0,0x1258832);
    local_f0 = '\0';
    puStack_240 = (undefined1 *)0xdec702;
    local_1d8 = (ExtensionRange *)local_1c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"emit_body","");
    local_e8 = &local_d8;
    if (local_1d8 == (ExtensionRange *)local_1c8) {
      local_d8.options_ = (ExtensionRangeOptions *)local_1c8._8_8_;
    }
    else {
      local_e8 = local_1d8;
    }
    local_e0 = local_1d0;
    local_1d0 = (FieldDescriptor *)0x0;
    local_1c8[0] = 0;
    local_b0 = std::
               _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
               ::_M_invoke;
    local_d8.proto_features_ = (FeatureSet *)0x0;
    local_d8.merged_features_ =
         (FeatureSet *)
         std::
         _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
         ::_M_manager;
    local_a8 = 1;
    local_a0 = local_90;
    local_98 = 0;
    local_90[0] = 0;
    local_80 = 0;
    puStack_240 = (undefined1 *)0xdec7bc;
    local_1d8 = (ExtensionRange *)local_1c8;
    local_d8.containing_type_ = (Descriptor *)field;
    std::__cxx11::string::_M_replace((ulong)&local_a0,0,(char *)0x0,0x1258832);
    local_38 = 0;
    puStack_240 = (undefined1 *)0xdec7e4;
    io::Printer::Emit(pPVar1,&local_1a0,2,0x4b,
                      "\n          if ($condition$) {\n            $emit_body$;\n          }\n        "
                     );
    lVar5 = 0x170;
    do {
      if (*(char *)((long)&local_1a8 + lVar5) == '\x01') {
        puStack_240 = (undefined1 *)0xdec80e;
        std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                  ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                   (local_1e8 + lVar5));
      }
      plVar3 = *(long **)((long)&local_210._M_head_impl + lVar5);
      if ((long *)((long)&lStack_200 + lVar5) != plVar3) {
        puStack_240 = (undefined1 *)0xdec82a;
        operator_delete(plVar3,*(long *)((long)&lStack_200 + lVar5) + 1);
      }
      puStack_240 = (undefined1 *)0xdec839;
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
        ::_S_vtable._M_arr[*(byte *)((long)&local_218 + lVar5)]._M_data)
                ((anon_class_1_0_00000001 *)(auStack_238 + 0xf),
                 (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                  *)(auStack_238 + lVar5));
      plVar3 = (long *)((long)alStack_258 + lVar5 + 0x10);
      *(undefined1 *)((long)&local_218 + lVar5) = 0xff;
      if (plVar3 != *(long **)((long)alStack_258 + lVar5)) {
        puStack_240 = (undefined1 *)0xdec859;
        operator_delete(*(long **)((long)alStack_258 + lVar5),*plVar3 + 1);
      }
      lVar5 = lVar5 + -0xb8;
    } while (lVar5 != 0);
    if (local_1d8 != (ExtensionRange *)local_1c8) {
      puStack_240 = (undefined1 *)0xdec879;
      operator_delete(local_1d8,CONCAT71(local_1c8._1_7_,local_1c8[0]) + 1);
    }
    if ((once_flag **)local_218.p == &local_208) {
      return;
    }
    lVar5 = CONCAT71(local_208._1_7_,local_208._0_1_);
    MVar4 = local_218;
  }
  else {
    if ((char)emit_body == '\0') {
      if (field->type_once_ == (once_flag *)0x0) {
        puStack_240 = &LAB_00deca05;
        __assert_fail("this->invoker_ != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/functional/internal/any_invocable.h"
                      ,0x364,
                      "ReturnType absl::internal_any_invocable::Impl<void ()>::operator()(P...) [Sig = void ()]"
                     );
      }
      (*(code *)field->type_once_)(field);
      return;
    }
    puStack_240 = (undefined1 *)0xdec5ba;
    local_1f8.p = local_1e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"emit_body","");
    if ((undefined1 *)local_1f8.p == local_1e8) {
      lStack_188 = local_1e8._8_8_;
      local_1a0.p = &local_190;
    }
    else {
      local_1a0.p = local_1f8.p;
    }
    local_190 = CONCAT71(local_1e8._1_7_,local_1e8[0]);
    local_198 = local_1f0;
    local_1f0 = (FeatureSetDefaults *)0x0;
    local_1e8[0] = 0;
    local_168 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                ::_M_invoke;
    local_180._8_8_ = 0;
    local_180._16_8_ =
         std::
         _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
         ::_M_manager;
    local_160 = 1;
    local_150 = 0;
    local_148[0] = '\0';
    local_148[0x10] = 0;
    puStack_240 = (undefined1 *)0xdec91e;
    local_1f8.p = local_1e8;
    local_180._0_8_ = field;
    local_158 = (Descriptor *)local_148;
    std::__cxx11::string::_M_replace((ulong)&local_158,0,(char *)0x0,0x1258832);
    local_f0 = '\0';
    puStack_240 = (undefined1 *)0xdec946;
    io::Printer::Emit(pPVar1,&local_1a0,1,0x6d,
                      "\n              {\n                //~ Force newline.\n                $emit_body$;\n              }\n            "
                     );
    if (local_f0 == '\x01') {
      puStack_240 = (undefined1 *)0xdec95d;
      std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                 (local_148 + 0x18));
    }
    if (local_158 != (Descriptor *)local_148) {
      puStack_240 = (undefined1 *)0xdec97e;
      operator_delete(local_158,CONCAT71(local_148._1_7_,local_148[0]) + 1);
    }
    puStack_240 = (undefined1 *)0xdec998;
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
      ::_S_vtable._M_arr[local_160]._M_data)
              ((anon_class_1_0_00000001 *)(auStack_238 + 0xf),
               (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                *)local_180);
    local_160 = 0xff;
    if ((long *)local_1a0.p != &local_190) {
      puStack_240 = (undefined1 *)0xdec9bd;
      operator_delete(local_1a0.p,local_190 + 1);
    }
    if ((undefined1 *)local_1f8.p == local_1e8) {
      return;
    }
    lVar5 = CONCAT71(local_1e8._1_7_,local_1e8[0]);
    MVar4 = local_1f8;
  }
  puStack_240 = (undefined1 *)0xdec9d4;
  operator_delete(MVar4.p,lVar5 + 1);
  return;
}

Assistant:

void MayEmitIfNonDefaultCheck(io::Printer* p, absl::string_view prefix,
                              const FieldDescriptor* field,
                              absl::AnyInvocable<void()> emit_body,
                              bool with_enclosing_braces_always) {
  if (ShouldEmitNonDefaultCheck(field)) {
    p->Emit(
        {
            {"condition", [&] { EmitNonDefaultCheck(p, prefix, field); }},
            {"emit_body", [&] { emit_body(); }},
        },
        R"cc(
          if ($condition$) {
            $emit_body$;
          }
        )cc");
    return;
  }

  if (with_enclosing_braces_always) {
    // In repeated fields, the same variable name may be emitted multiple
    // times, hence the need for emitting braces even when the if condition is
    // not necessary, so that the code looks like:
    // {
    //   int tmpvar = ...;
    //   total += tmpvar;
    // }
    // {
    //   int tmpvar = ...;
    //   total += tmpvar;
    // }
    p->Emit({{"emit_body", [&] { emit_body(); }}},
            R"cc(
              {
                //~ Force newline.
                $emit_body$;
              }
            )cc");
    return;
  }

  // If no enclosing braces need to be emitted, just emit the body directly.
  emit_body();
}